

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.h
# Opt level: O3

void __thiscall
rapidjson::
GenericSchemaValidator<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>,_rapidjson::BaseReaderHandler<rapidjson::UTF8<char>,_void>,_rapidjson::CrtAllocator>
::AddMissingDependentProperty
          (GenericSchemaValidator<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>,_rapidjson::BaseReaderHandler<rapidjson::UTF8<char>,_void>,_rapidjson::CrtAllocator>
           *this,SValue *targetName)

{
  CrtAllocator *pCVar1;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> local_20;
  
  pCVar1 = this->stateAllocator_;
  if (pCVar1 == (CrtAllocator *)0x0) {
    pCVar1 = (CrtAllocator *)operator_new(1);
    this->ownStateAllocator_ = pCVar1;
    this->stateAllocator_ = pCVar1;
  }
  GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
  GenericValue<rapidjson::CrtAllocator>(&local_20,targetName,pCVar1,false);
  pCVar1 = this->stateAllocator_;
  if (pCVar1 == (CrtAllocator *)0x0) {
    pCVar1 = (CrtAllocator *)operator_new(1);
    this->ownStateAllocator_ = pCVar1;
    this->stateAllocator_ = pCVar1;
  }
  GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::PushBack
            (&this->missingDependents_,&local_20,pCVar1);
  GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::~GenericValue(&local_20);
  return;
}

Assistant:

void AddMissingDependentProperty(const SValue& targetName) {
        missingDependents_.PushBack(ValueType(targetName, GetStateAllocator()).Move(), GetStateAllocator());
    }